

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_fprintdot(FILE *out,MDD mdd)

{
  MDD mdd_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"digraph \"DD\" {\n");
  fprintf((FILE *)out,"graph [dpi = 300];\n");
  fprintf((FILE *)out,"center = true;\n");
  fprintf((FILE *)out,"edge [dir = forward];\n");
  if (mdd == 0) {
    fprintf((FILE *)out,"0 [shape=record, label=\"False\"];\n");
    fprintf((FILE *)out,"}\n");
  }
  else if (mdd == 1) {
    fprintf((FILE *)out,"1 [shape=record, label=\"True\"];\n");
    fprintf((FILE *)out,"}\n");
  }
  else {
    lddmc_fprintdot_rec(out,mdd);
    lddmc_fprintdot_unmark(mdd);
    fprintf((FILE *)out,"}\n");
  }
  return;
}

Assistant:

void
lddmc_fprintdot(FILE *out, MDD mdd)
{
    fprintf(out, "digraph \"DD\" {\n");
    fprintf(out, "graph [dpi = 300];\n");
    fprintf(out, "center = true;\n");
    fprintf(out, "edge [dir = forward];\n");

    // Special case: false
    if (mdd == lddmc_false) {
        fprintf(out, "0 [shape=record, label=\"False\"];\n");
        fprintf(out, "}\n");
        return;
    }

    // Special case: true
    if (mdd == lddmc_true) {
        fprintf(out, "1 [shape=record, label=\"True\"];\n");
        fprintf(out, "}\n");
        return;
    }

    lddmc_fprintdot_rec(out, mdd);
    lddmc_fprintdot_unmark(mdd);

    fprintf(out, "}\n");
}